

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

bool __thiscall front::syntax::SyntaxAnalyze::find_word(SyntaxAnalyze *this,Token tk,Token end)

{
  pointer pWVar1;
  pointer pWVar2;
  bool bVar3;
  size_t sVar4;
  long lVar5;
  
  sVar4 = this->matched_index;
  pWVar1 = (this->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pWVar2 = (this->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = sVar4 * 0x30;
  while( true ) {
    sVar4 = sVar4 + 1;
    if ((ulong)(((long)pWVar1 - (long)pWVar2 >> 4) * -0x5555555555555555) <= sVar4) {
      return false;
    }
    bVar3 = word::Word::match_token
                      ((Word *)((long)&(this->word_list->
                                       super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                                       )._M_impl.super__Vector_impl_data._M_start[1].token_value +
                               lVar5),tk);
    if (bVar3) break;
    bVar3 = word::Word::match_token
                      ((Word *)((long)&(this->word_list->
                                       super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                                       )._M_impl.super__Vector_impl_data._M_start[1].token_value +
                               lVar5),end);
    lVar5 = lVar5 + 0x30;
    if (bVar3) {
      return false;
    }
  }
  return true;
}

Assistant:

bool SyntaxAnalyze::find_word(Token tk, Token end) {
  size_t size = word_list.size();
  bool r = false;
  for (size_t i = matched_index + 1; i < size; i++) {
    if (word_list[i].match_token(tk)) {
      r = true;
      break;
    } else if (word_list[i].match_token(end)) {
      break;
    }
  }
  return r;
}